

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

EmptyQueueExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::EmptyQueueExpressionSyntax,slang::syntax::EmptyQueueExpressionSyntax_const&>
          (BumpAllocator *this,EmptyQueueExpressionSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  Info *pIVar3;
  undefined4 uVar4;
  TokenKind TVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  EmptyQueueExpressionSyntax *pEVar13;
  
  pEVar13 = (EmptyQueueExpressionSyntax *)allocate(this,0x38,8);
  uVar4 = *(undefined4 *)
           &(args->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.parent;
  pSVar2 = (args->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.previewNode
  ;
  TVar5 = (args->openBrace).kind;
  uVar6 = (args->openBrace).field_0x2;
  NVar7.raw = (args->openBrace).numFlags.raw;
  uVar8 = (args->openBrace).rawLen;
  pIVar3 = (args->openBrace).info;
  TVar9 = (args->closeBrace).kind;
  uVar10 = (args->closeBrace).field_0x2;
  NVar11.raw = (args->closeBrace).numFlags.raw;
  uVar12 = (args->closeBrace).rawLen;
  (pEVar13->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.kind =
       (args->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pEVar13->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.field_0x4 =
       uVar4;
  (pEVar13->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.parent = pSVar1;
  (pEVar13->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.previewNode =
       pSVar2;
  (pEVar13->openBrace).kind = TVar5;
  (pEVar13->openBrace).field_0x2 = uVar6;
  (pEVar13->openBrace).numFlags = (NumericTokenFlags)NVar7.raw;
  (pEVar13->openBrace).rawLen = uVar8;
  (pEVar13->openBrace).info = pIVar3;
  (pEVar13->closeBrace).kind = TVar9;
  (pEVar13->closeBrace).field_0x2 = uVar10;
  (pEVar13->closeBrace).numFlags = (NumericTokenFlags)NVar11.raw;
  (pEVar13->closeBrace).rawLen = uVar12;
  (pEVar13->closeBrace).info = (args->closeBrace).info;
  return pEVar13;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }